

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRGBA.hpp
# Opt level: O2

RGBA tcu::operator*(RGBA *a,int b)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  uVar1 = a->m_value;
  uVar5 = (uVar1 & 0xff) * b;
  uVar2 = 0xff;
  if (uVar5 < 0xff) {
    uVar2 = uVar5;
  }
  uVar4 = 0;
  if ((int)uVar5 < 0) {
    uVar2 = uVar4;
  }
  uVar6 = (uVar1 >> 8 & 0xff) * b;
  uVar5 = 0xff;
  if (uVar6 < 0xff) {
    uVar5 = uVar6;
  }
  uVar7 = (uVar1 >> 0x10 & 0xff) * b;
  uVar8 = 0xff;
  if (uVar7 < 0xff) {
    uVar8 = uVar7;
  }
  uVar3 = (uVar1 >> 0x18) * b;
  uVar1 = 0xff;
  if (uVar3 < 0xff) {
    uVar1 = uVar3;
  }
  uVar1 = uVar1 << 0x18;
  if ((int)uVar3 < 0) {
    uVar1 = uVar4;
  }
  uVar5 = uVar5 << 8;
  if ((int)uVar6 < 0) {
    uVar5 = uVar4;
  }
  uVar6 = uVar8 << 0x10;
  if ((int)uVar7 < 0) {
    uVar6 = uVar4;
  }
  return (RGBA)(uVar1 | uVar2 | uVar5 | uVar6);
}

Assistant:

int			getRed					(void) const { return (int)((m_value >> (deUint32)RED_SHIFT)   & 0xFFu); }